

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

CoverpointSymbol * slang::ast::CoverpointSymbol::fromSyntax(Scope *scope,CoverpointSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *args;
  SyntaxNode *pSVar2;
  pointer ppMVar3;
  size_t sVar4;
  CoverageOptionSyntax *syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  CoverpointSymbol *this;
  SourceLocation SVar5;
  long lVar6;
  Token *this_00;
  span<const_slang::ast::CoverageOptionSetter,_18446744073709551615UL> sVar7;
  OptionBuilder options;
  SourceLocation local_210;
  Token local_208;
  Token local_1f8;
  
  args = scope->compilation;
  if (((syntax->coverpoint).field_0x2 & 1) == 0) {
    local_208 = (Token)ZEXT816(0);
    if (syntax->label == (NamedLabelSyntax *)0x0) {
      pSVar2 = &((syntax->expr).ptr)->super_SyntaxNode;
      if (pSVar2->kind == IdentifierName) {
        local_1f8 = *(Token *)(pSVar2 + 1);
        this_00 = &local_1f8;
        local_208 = (Token)parsing::Token::valueText(this_00);
      }
      else {
        local_1f8 = slang::syntax::SyntaxNode::getFirstToken(pSVar2);
        this_00 = &local_1f8;
      }
    }
    else {
      local_208 = (Token)parsing::Token::valueText(&syntax->label->name);
      this_00 = &syntax->label->name;
    }
    local_210 = parsing::Token::location(this_00);
    this = BumpAllocator::
           emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
                     (&args->super_BumpAllocator,args,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_208,&local_210);
    (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
    syntax_01._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_01._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
    (this->declaredType).typeOrLink = (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
    puVar1 = &(this->declaredType).field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    pSVar2 = &((syntax->expr).ptr)->super_SyntaxNode;
    local_1f8 = slang::syntax::SyntaxNode::getFirstToken(pSVar2);
    SVar5 = parsing::Token::location(&local_1f8);
    (this->declaredType).initializerSyntax = (ExpressionSyntax *)pSVar2;
    (this->declaredType).initializerLocation = SVar5;
    anon_unknown.dwarf_619fee::OptionBuilder::OptionBuilder
              ((OptionBuilder *)&local_1f8,&this->super_Scope);
    ppMVar3 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    sVar4 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
            _M_extent._M_extent_value;
    for (lVar6 = 0; sVar4 << 3 != lVar6; lVar6 = lVar6 + 8) {
      syntax_00 = *(CoverageOptionSyntax **)((long)ppMVar3 + lVar6);
      if ((syntax_00->super_MemberSyntax).super_SyntaxNode.kind == CoverageOption) {
        anon_unknown.dwarf_619fee::OptionBuilder::add((OptionBuilder *)&local_1f8,syntax_00);
      }
      else {
        Scope::addMembers(&this->super_Scope,(SyntaxNode *)syntax_00);
      }
    }
    sVar7 = anon_unknown.dwarf_619fee::OptionBuilder::get((OptionBuilder *)&local_1f8);
    this->options = sVar7;
    anon_unknown.dwarf_619fee::OptionBuilder::~OptionBuilder((OptionBuilder *)&local_1f8);
  }
  else {
    local_1f8 = (Token)(ZEXT816(0x4175a7) << 0x40);
    local_208 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)syntax);
    local_210 = parsing::Token::location(&local_208);
    this = BumpAllocator::
           emplace<slang::ast::CoverpointSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                     (&args->super_BumpAllocator,args,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_1f8,&local_210);
    (this->declaredType).type = args->errorType;
  }
  return this;
}

Assistant:

CoverpointSymbol& CoverpointSymbol::fromSyntax(const Scope& scope, const CoverpointSyntax& syntax) {
    // It's possible for invalid syntax to parse as a coverpoint. If the keyword wasn't
    // given just give up and return a placeholder.
    auto& comp = scope.getCompilation();
    if (syntax.coverpoint.isMissing()) {
        auto result = comp.emplace<CoverpointSymbol>(comp, ""sv, syntax.getFirstToken().location());
        result->declaredType.setType(comp.getErrorType());
        return *result;
    }

    // Figure out the name of the coverpoint. If there's a label, it provides the name.
    // Otherwise check if the expression is a simple variable reference. If so, we take
    // that variable name as the name of the coverpoint. Otherwise it's unnamed.
    std::string_view name;
    SourceLocation loc;
    if (syntax.label) {
        name = syntax.label->name.valueText();
        loc = syntax.label->name.location();
    }
    else if (syntax.expr->kind == SyntaxKind::IdentifierName) {
        auto id = syntax.expr->as<IdentifierNameSyntax>().identifier;
        name = id.valueText();
        loc = id.location();
    }
    else {
        loc = syntax.expr->getFirstToken().location();
    }

    auto result = comp.emplace<CoverpointSymbol>(comp, name, loc);
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    result->declaredType.setTypeSyntax(*syntax.type);
    result->declaredType.setInitializerSyntax(*syntax.expr,
                                              syntax.expr->getFirstToken().location());

    OptionBuilder options(*result);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            options.add(member->as<CoverageOptionSyntax>());
        else
            result->addMembers(*member);
    }

    result->options = options.get();
    return *result;
}